

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O1

REF_STATUS ref_sort_unique_int(REF_INT n,REF_INT *original,REF_INT *nunique,REF_INT *unique)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  *nunique = -1;
  ref_sort_insertion_int(n,original,unique);
  iVar2 = 1;
  if (1 < n) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      uVar1 = (uint)(unique[uVar3] != unique[uVar4]) + (int)uVar3;
      uVar3 = (ulong)uVar1;
      if (uVar4 != uVar3) {
        unique[uVar3] = unique[uVar4];
      }
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
    iVar2 = uVar1 + 1;
  }
  *nunique = iVar2;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_sort_unique_int(REF_INT n, REF_INT *original,
                                       REF_INT *nunique, REF_INT *unique) {
  REF_INT i, j;

  *nunique = REF_EMPTY;

  RSS(ref_sort_insertion_int(n, original, unique), "sort in unique");

  j = 0;
  for (i = 1; i < n; i++) {
    if (unique[j] != unique[i]) j++;
    if (j != i) unique[j] = unique[i];
  }

  *nunique = j + 1;

  return REF_SUCCESS;
}